

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O1

SUNLinearSolver SUNLinSol_Band(N_Vector y,SUNMatrix A)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  sunindextype sVar6;
  SUNLinearSolver __ptr;
  _generic_SUNLinearSolver_Ops *__ptr_00;
  long *__ptr_01;
  void *pvVar7;
  
  iVar1 = SUNMatGetID(A);
  if (iVar1 == 1) {
    lVar2 = SUNBandMatrix_Rows(A);
    lVar3 = SUNBandMatrix_Columns(A);
    if (lVar2 == lVar3) {
      lVar2 = SUNBandMatrix_Rows(A);
      iVar1 = N_VGetVectorID(y);
      if (((iVar1 == 0) || (iVar1 = N_VGetVectorID(y), iVar1 == 2)) ||
         (iVar1 = N_VGetVectorID(y), iVar1 == 3)) {
        lVar3 = SUNBandMatrix_StoredUpperBandwidth(A);
        lVar4 = SUNBandMatrix_LowerBandwidth(A);
        lVar5 = SUNBandMatrix_UpperBandwidth(A);
        if (lVar5 + lVar4 < lVar2) {
          lVar5 = SUNBandMatrix_LowerBandwidth(A);
          lVar4 = SUNBandMatrix_UpperBandwidth(A);
          lVar4 = lVar4 + lVar5;
        }
        else {
          lVar4 = lVar2 + -1;
        }
        if (((lVar4 <= lVar3) && (sVar6 = GlobalVectorLength_BandLS(y), lVar2 == sVar6)) &&
           (__ptr = (SUNLinearSolver)malloc(0x10), __ptr != (SUNLinearSolver)0x0)) {
          __ptr_00 = (_generic_SUNLinearSolver_Ops *)malloc(0x68);
          if (__ptr_00 != (_generic_SUNLinearSolver_Ops *)0x0) {
            __ptr_00->gettype = SUNLinSolGetType_Band;
            __ptr_00->initialize = SUNLinSolInitialize_Band;
            __ptr_00->setup = SUNLinSolSetup_Band;
            __ptr_00->solve = SUNLinSolSolve_Band;
            __ptr_00->lastflag = SUNLinSolLastFlag_Band;
            __ptr_00->space = SUNLinSolSpace_Band;
            __ptr_00->free = SUNLinSolFree_Band;
            __ptr_00->resid = (_func_N_Vector_SUNLinearSolver *)0x0;
            __ptr_01 = (long *)malloc(0x18);
            __ptr_00->setatimes = (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0;
            __ptr_00->setpreconditioner =
                 (_func_int_SUNLinearSolver_void_ptr_PSetupFn_PSolveFn *)0x0;
            __ptr_00->setscalingvectors = (_func_int_SUNLinearSolver_N_Vector_N_Vector *)0x0;
            __ptr_00->numiters = (_func_int_SUNLinearSolver *)0x0;
            __ptr_00->resnorm = (_func_realtype_SUNLinearSolver *)0x0;
            if (__ptr_01 != (long *)0x0) {
              *__ptr_01 = lVar2;
              pvVar7 = malloc(lVar2 << 3);
              __ptr_01[1] = 0;
              __ptr_01[2] = 0;
              __ptr_01[1] = (long)pvVar7;
              if (pvVar7 != (void *)0x0) {
                __ptr->content = __ptr_01;
                __ptr->ops = __ptr_00;
                return __ptr;
              }
              free(__ptr_01);
            }
            free(__ptr_00);
          }
          free(__ptr);
        }
      }
    }
  }
  return (SUNLinearSolver)0x0;
}

Assistant:

SUNLinearSolver SUNLinSol_Band(N_Vector y, SUNMatrix A)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_Band content;
  sunindextype MatrixRows, VecLength;
  
  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return(NULL);
  if (SUNBandMatrix_Rows(A) != SUNBandMatrix_Columns(A))
    return(NULL);
  MatrixRows = SUNBandMatrix_Rows(A);
  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  /* Check that A has appropriate storage upper bandwidth for factorization */
  if (SUNBandMatrix_StoredUpperBandwidth(A) <
      SUNMIN(MatrixRows-1, SUNBandMatrix_LowerBandwidth(A)+SUNBandMatrix_UpperBandwidth(A)))
    return(NULL);

  /* optimally this function would be replaced with a generic N_Vector routine */
  VecLength = GlobalVectorLength_BandLS(y);
  if (MatrixRows != VecLength)
    return(NULL);
  
  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_Band;
  ops->initialize        = SUNLinSolInitialize_Band;
  ops->setup             = SUNLinSolSetup_Band;
  ops->solve             = SUNLinSolSolve_Band;
  ops->lastflag          = SUNLinSolLastFlag_Band;
  ops->space             = SUNLinSolSpace_Band;
  ops->free              = SUNLinSolFree_Band;
  ops->setatimes         = NULL;
  ops->setpreconditioner = NULL;
  ops->setscalingvectors = NULL;
  ops->numiters          = NULL;
  ops->resnorm           = NULL;
  ops->resid             = NULL;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Band) malloc(sizeof(struct _SUNLinearSolverContent_Band));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->N = MatrixRows;
  content->last_flag = 0;
  content->pivots = NULL;
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) {
    free(content); free(ops); free(S); return(NULL);
  }
  
  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}